

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# imgui_draw.cpp
# Opt level: O2

void __thiscall ImDrawList::AddDrawCmd(ImDrawList *this)

{
  ImDrawCmd local_48;
  
  local_48.ElemCount = 0;
  local_48._36_4_ = 0;
  local_48.UserCallback = (ImDrawCallback)0x0;
  local_48.UserCallbackData = (void *)0x0;
  local_48.ClipRect.x = (this->_CmdHeader).ClipRect.x;
  local_48.ClipRect.y = (this->_CmdHeader).ClipRect.y;
  local_48.ClipRect.z = (this->_CmdHeader).ClipRect.z;
  local_48.ClipRect.w = (this->_CmdHeader).ClipRect.w;
  local_48.TextureId = (this->_CmdHeader).TextureId;
  local_48.VtxOffset = (this->_CmdHeader).VtxOffset;
  local_48.IdxOffset = (this->IdxBuffer).Size;
  if ((local_48.ClipRect.z < local_48.ClipRect.x) || (local_48.ClipRect.w < local_48.ClipRect.y)) {
    LogFatalMsg("/workspace/llm4binary/github/license_c_cmakelists/TwinFan[P]LiveTraffic/Lib/ImGui/imgui_draw.cpp"
                ,0x1c1,"AddDrawCmd","ImGui ASSERT FAILED: %s",
                "draw_cmd.ClipRect.x <= draw_cmd.ClipRect.z && draw_cmd.ClipRect.y <= draw_cmd.ClipRect.w"
               );
  }
  ImVector<ImDrawCmd>::push_back(&this->CmdBuffer,&local_48);
  return;
}

Assistant:

void ImDrawList::AddDrawCmd()
{
    ImDrawCmd draw_cmd;
    draw_cmd.ClipRect = _CmdHeader.ClipRect;    // Same as calling ImDrawCmd_HeaderCopy()
    draw_cmd.TextureId = _CmdHeader.TextureId;
    draw_cmd.VtxOffset = _CmdHeader.VtxOffset;
    draw_cmd.IdxOffset = IdxBuffer.Size;

    IM_ASSERT(draw_cmd.ClipRect.x <= draw_cmd.ClipRect.z && draw_cmd.ClipRect.y <= draw_cmd.ClipRect.w);
    CmdBuffer.push_back(draw_cmd);
}